

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

Gia_Man_t * Gia_ManFromIfLogic(If_Man_t *pIfMan)

{
  If_Cut_t *pCut;
  uint uVar1;
  uint uVar2;
  If_Par_t *pIVar3;
  If_Obj_t *pIfObj;
  void *pvVar4;
  Gia_Obj_t *pGVar5;
  word *pwVar6;
  Vec_Mem_t *pVVar7;
  word wVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Vec_Int_t *p;
  int *piVar13;
  Vec_Int_t *p_00;
  char *pcVar14;
  Gia_Man_t *pNew;
  Vec_Int_t *vLits;
  Vec_Int_t *vCover;
  Vec_Int_t *p_01;
  Vec_Int_t *vLeavesTemp;
  Vec_Ptr_t *pVVar15;
  Gia_Obj_t *pGVar16;
  word *pwVar17;
  size_t sVar18;
  char *__dest;
  FILE *__s;
  byte bVar19;
  int Fill;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  word *pwVar25;
  ulong uVar26;
  Vec_Str_t *local_470;
  Vec_Int_t *local_448;
  Vec_Int_t *local_440;
  sat_solver *local_438;
  char Buffer [1000];
  
  pIVar3 = pIfMan->pPars;
  if ((pIVar3->fDeriveLuts != 0) && (pIVar3->fTruth == 0)) {
    __assert_fail("!pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x702,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  iVar9 = pIfMan->vObjs->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar10 = iVar9;
  }
  p->nSize = 0;
  p->nCap = iVar10;
  if (iVar10 == 0) {
    piVar13 = (int *)0x0;
  }
  else {
    piVar13 = (int *)malloc((long)iVar10 << 2);
  }
  p->pArray = piVar13;
  p->nSize = iVar9;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0,(long)iVar9 << 2);
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar13 = (int *)malloc(0x40);
  p_00->pArray = piVar13;
  p_00->nSize = 1;
  if (piVar13 != (int *)0x0) {
    *piVar13 = 0;
  }
  if ((pIVar3->fDeriveLuts == 0) ||
     ((((pIVar3->pLutStruct == (char *)0x0 && (pIVar3->fEnableCheck75 == 0)) &&
       (pIVar3->fEnableCheck75u == 0)) && (pIVar3->fEnableCheck07 == 0)))) {
    local_440 = (Vec_Int_t *)0x0;
  }
  else {
    local_440 = (Vec_Int_t *)malloc(0x10);
    local_440->nCap = 1000;
    local_440->nSize = 0;
    piVar13 = (int *)malloc(4000);
    local_440->pArray = piVar13;
    Vec_IntPush(local_440,0);
  }
  if (pIfMan->pPars->fUseDsdTune == 0) {
    local_470 = (Vec_Str_t *)0x0;
    local_448 = (Vec_Int_t *)0x0;
  }
  else {
    iVar9 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    iVar10 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    uVar11 = iVar10 + iVar9 + 1;
    local_448 = (Vec_Int_t *)malloc(0x10);
    local_448->nCap = 1000;
    local_448->nSize = 0;
    piVar13 = (int *)malloc(4000);
    local_448->pArray = piVar13;
    Vec_IntPush(local_448,0);
    Vec_IntPush(local_448,(((int)uVar11 >> 5) + 1) - (uint)((uVar11 & 0x1f) == 0));
    local_470 = (Vec_Str_t *)malloc(0x10);
    local_470->nCap = 1000;
    local_470->nSize = 0;
    pcVar14 = (char *)malloc(1000);
    local_470->pArray = pcVar14;
  }
  pNew = Gia_ManStart(pIfMan->vObjs->nSize);
  vLits = (Vec_Int_t *)malloc(0x10);
  vLits->nCap = 1000;
  vLits->nSize = 0;
  piVar13 = (int *)malloc(4000);
  vLits->pArray = piVar13;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar13 = (int *)malloc(0x40000);
  vCover->pArray = piVar13;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x10;
  p_01->nSize = 0;
  piVar13 = (int *)malloc(0x40);
  p_01->pArray = piVar13;
  vLeavesTemp = (Vec_Int_t *)malloc(0x10);
  vLeavesTemp->nCap = 0x10;
  vLeavesTemp->nSize = 0;
  piVar13 = (int *)malloc(0x40);
  vLeavesTemp->pArray = piVar13;
  If_ManCleanCutData(pIfMan);
  pVVar15 = pIfMan->vObjs;
  if (0 < pVVar15->nSize) {
    lVar21 = 0;
    local_438 = (sat_solver *)0x0;
LAB_002129e5:
    pIfObj = (If_Obj_t *)pVVar15->pArray[lVar21];
    if ((pIfObj->nRefs == 0) &&
       (((undefined1  [112])*pIfObj & (undefined1  [112])0xe) != (undefined1  [112])0x2))
    goto LAB_00212cb0;
    switch(*(uint *)pIfObj & 0xf) {
    case 1:
      (pIfObj->field_22).iCopy = 1;
      if (p->nSize < 1) goto LAB_0021396b;
      *p->pArray = p_00->nSize;
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,0);
      break;
    case 2:
      pGVar16 = Gia_ManAppendObj(pNew);
      uVar22 = *(ulong *)pGVar16;
      *(ulong *)pGVar16 = uVar22 | 0x9fffffff;
      *(ulong *)pGVar16 =
           uVar22 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = pNew->pObjs;
      if ((pGVar5 <= pGVar16) && (pGVar16 < pGVar5 + pNew->nObjs)) {
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar16 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = pNew->pObjs;
        if ((pGVar5 <= pGVar16) && (pGVar16 < pGVar5 + pNew->nObjs)) {
          iVar9 = (int)((ulong)((long)pGVar16 - (long)pGVar5) >> 2) * 0x55555556;
          goto LAB_00212cac;
        }
      }
      goto LAB_00213892;
    case 3:
      uVar11 = (pIfObj->pFanin0->field_22).iCopy;
      if ((int)uVar11 < 0) goto LAB_0021390e;
      iVar9 = Gia_ManAppendCo(pNew,uVar11 ^ *(uint *)pIfObj >> 4 & 1);
LAB_00212cac:
      (pIfObj->field_22).iCopy = iVar9;
      break;
    case 4:
      pCut = &pIfObj->CutBest;
      pIVar3 = pIfMan->pPars;
      if ((((((pIVar3->fUseTtPerm == 0) && (pIVar3->fDelayOpt == 0)) &&
            ((pIVar3->fDelayOptLut == 0 &&
             (((pIVar3->fDsdBalance == 0 && (pIVar3->pLutStruct == (char *)0x0)) &&
              (pIVar3->fUserRecLib == 0)))))) &&
           ((pIVar3->fUserSesLib == 0 && (pIVar3->nGateSize == 0)))) &&
          (pIVar3->fEnableCheck75 == 0)) &&
         (((pIVar3->fEnableCheck75u == 0 && (pIVar3->fEnableCheck07 == 0)) &&
          ((pIVar3->fUseDsdTune == 0 && ((pIVar3->fUseCofVars == 0 && (pIVar3->fUseAndVars == 0)))))
          ))) {
        If_CutRotatePins(pIfMan,pCut);
      }
      p_01->nSize = 0;
      uVar11 = *(uint *)&(pIfObj->CutBest).field_0x1c;
      uVar22 = (ulong)(uVar11 >> 0x18);
      if (0xffffff < uVar11) {
        uVar23 = 0;
        do {
          iVar9 = *(int *)(&pIfObj[1].field_0x0 + uVar23 * 4);
          if (((long)iVar9 < 0) || (pIfMan->vObjs->nSize <= iVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = pIfMan->vObjs->pArray[iVar9];
          if (pvVar4 == (void *)0x0) break;
          Vec_IntPush(p_01,*(int *)((long)pvVar4 + 0x40));
          uVar23 = uVar23 + 1;
          uVar22 = (ulong)(byte)(pIfObj->CutBest).field_0x1f;
        } while (uVar23 < uVar22);
      }
      pIVar3 = pIfMan->pPars;
      iVar9 = pIVar3->fUseDsd;
      if ((iVar9 == 0) || (pIVar3->pLutStruct == (char *)0x0)) {
        iVar10 = (int)uVar22;
        if (pIVar3->fUseAndVars == 0) {
LAB_00212d6d:
          if (((pIVar3->fUseCofVars == 0) || (pIVar3->fDeriveLuts == 0)) ||
             (iVar10 <= pIVar3->nLutSize / 2)) {
            if (pIVar3->fDeriveLuts == 0) {
              if (iVar9 == 0) goto LAB_00212e30;
            }
            else if (iVar9 == 0 && pIVar3->fTruth == 0) {
LAB_00212e30:
              if ((pIVar3->fUseTtPerm == 0) &&
                 (pIVar3->pFuncCell2 ==
                  (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
                uVar11 = Gia_ManNodeIfToGia(pNew,pIfMan,pIfObj,p_01,0);
                (pIfObj->field_22).iCopy = uVar11;
                if ((int)uVar11 < 0) {
LAB_0021392d:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar11 = uVar11 >> 1;
                iVar9 = p_00->nSize;
                Vec_IntFillExtra(p,uVar11 + 1,Fill);
                if (p->nSize <= (int)uVar11) {
LAB_0021396b:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                p->pArray[uVar11] = iVar9;
                Vec_IntPush(p_00,p_01->nSize);
                if (0 < (long)p_01->nSize) {
                  lVar20 = 0;
                  do {
                    if ((p_01->pArray[lVar20] < 0) || ((pIfObj->field_22).iCopy < 0))
                    goto LAB_0021392d;
                    if ((uint)(pIfObj->field_22).iCopy >> 1 <= (uint)p_01->pArray[lVar20] >> 1) {
                      __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                                    ,0x773,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
                    }
                    lVar20 = lVar20 + 1;
                  } while (p_01->nSize != lVar20);
                }
                if (0 < p_01->nSize) {
                  lVar20 = 0;
                  do {
                    if (p_01->pArray[lVar20] < 0) goto LAB_0021392d;
                    Vec_IntPush(p_00,(uint)p_01->pArray[lVar20] >> 1);
                    lVar20 = lVar20 + 1;
                  } while (lVar20 < p_01->nSize);
                }
                if ((pIfObj->field_22).iCopy < 0) goto LAB_0021392d;
                Vec_IntPush(p_00,(uint)(pIfObj->field_22).iCopy >> 1);
                break;
              }
            }
            uVar11 = (pIfObj->CutBest).iCutFunc;
            if ((int)uVar11 < 0) {
LAB_002139a9:
              __assert_fail("pCut->iCutFunc >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                            ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
            }
            pwVar6 = pIfMan->puTempW;
            pVVar7 = pIfMan->vTtMem[uVar22];
            if (pVVar7 == (Vec_Mem_t *)0x0) {
              pwVar17 = (word *)0x0;
            }
            else {
              uVar12 = uVar11 >> 1;
              if (pVVar7->nEntries <= (int)uVar12) {
LAB_002139e7:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              pwVar17 = pVVar7->ppPages[uVar12 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                        (ulong)(uVar12 & pVVar7->PageMask) * (long)pVVar7->nEntrySize;
            }
            uVar12 = pIfMan->nTruth6Words[uVar22];
            if ((uVar11 & 1) == 0) {
              if (0 < (int)uVar12) {
                uVar22 = 0;
                do {
                  pwVar6[uVar22] = pwVar17[uVar22];
                  uVar22 = uVar22 + 1;
                } while (uVar12 != uVar22);
              }
            }
            else if (0 < (int)uVar12) {
              uVar22 = 0;
              do {
                pwVar6[uVar22] = ~pwVar17[uVar22];
                uVar22 = uVar22 + 1;
              } while (uVar12 != uVar22);
            }
            if ((pIVar3->fUseTtPerm != 0) &&
               (uVar11 = *(uint *)&(pIfObj->CutBest).field_0x1c, 0xffffff < uVar11)) {
              uVar23 = (ulong)(uVar11 >> 0x18);
              uVar12 = (pIfObj->CutBest).uMaskFunc;
              uVar22 = 0;
              do {
                if ((uVar12 >> ((uint)uVar22 & 0x1f) & 1) != 0) {
                  iVar9 = (int)uVar23 + -6;
                  uVar24 = 1 << ((byte)iVar9 & 0x1f);
                  if ((uVar11 < 0x7000000) || (iVar9 == 0)) {
                    bVar19 = (byte)(1 << ((byte)uVar22 & 0x1f));
                    *pwVar6 = (Gia_ManFromIfLogicNode::Truth6[uVar22] & *pwVar6) >> (bVar19 & 0x3f)
                              | *pwVar6 << (bVar19 & 0x3f) & Gia_ManFromIfLogicNode::Truth6[uVar22];
                  }
                  else if (uVar22 < 6) {
                    if (iVar9 != 0x1f) {
                      uVar23 = Gia_ManFromIfLogicNode::Truth6[uVar22];
                      uVar26 = 0;
                      do {
                        bVar19 = (byte)(1 << ((byte)uVar22 & 0x1f));
                        pwVar6[uVar26] =
                             (pwVar6[uVar26] & uVar23) >> (bVar19 & 0x3f) |
                             pwVar6[uVar26] << (bVar19 & 0x3f) & uVar23;
                        uVar26 = uVar26 + 1;
                      } while (uVar24 != uVar26);
                    }
                  }
                  else if (iVar9 != 0x1f) {
                    bVar19 = (byte)(uVar22 - 6);
                    uVar11 = 1 << (bVar19 & 0x1f);
                    iVar9 = 2 << (bVar19 & 0x1f);
                    uVar23 = 1;
                    if (1 < (int)uVar11) {
                      uVar23 = (ulong)uVar11;
                    }
                    pwVar17 = pwVar6 + (int)uVar11;
                    pwVar25 = pwVar6;
                    do {
                      if (uVar22 - 6 != 0x1f) {
                        uVar26 = 0;
                        do {
                          wVar8 = pwVar25[uVar26];
                          pwVar25[uVar26] = pwVar17[uVar26];
                          pwVar17[uVar26] = wVar8;
                          uVar26 = uVar26 + 1;
                        } while (uVar23 != uVar26);
                      }
                      pwVar25 = pwVar25 + iVar9;
                      pwVar17 = pwVar17 + iVar9;
                    } while (pwVar25 < pwVar6 + (int)uVar24);
                  }
                }
                uVar22 = uVar22 + 1;
                uVar11 = *(uint *)&(pIfObj->CutBest).field_0x1c;
                uVar23 = (ulong)(uVar11 >> 0x18);
              } while (uVar22 < uVar23);
            }
            uVar11 = 1;
            if (pIVar3->fEnableCheck75 == 0) {
              uVar11 = (uint)(pIVar3->fEnableCheck75u != 0);
            }
            uVar11 = Gia_ManFromIfLogicNode
                               (pIfMan,pNew,(int)lVar21,p_01,vLeavesTemp,pwVar6,pIVar3->pLutStruct,
                                vCover,p,p_00,local_440,uVar11,pIVar3->fEnableCheck07);
            (pIfObj->field_22).iCopy = uVar11;
            if ((int)uVar11 < 0) {
LAB_0021390e:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            uVar12 = *(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1 ^ uVar11;
            (pIfObj->field_22).iCopy = uVar12;
            if ((local_448 != (Vec_Int_t *)0x0) && (1 < p_01->nSize)) {
              if ((int)(uVar11 >> 1) < pNew->nObjs) {
                if ((((undefined1  [12])pNew->pObjs[uVar11 >> 1] & (undefined1  [12])0x9fffffff) !=
                     (undefined1  [12])0x9fffffff) && (1 < (int)uVar12)) {
                  Gia_ManFromIfGetConfig(local_448,pIfMan,pCut,uVar12,local_470);
                }
                break;
              }
              goto LAB_00213873;
            }
            break;
          }
        }
        else {
          if (((pIVar3->fUseCofVars == 0) || (pIVar3->fDeriveLuts == 0)) ||
             (iVar10 <= pIVar3->nLutSize / 2)) {
            if (((pIVar3->fUseAndVars != 0) && (pIVar3->fDeriveLuts != 0)) &&
               (pIVar3->nLutSize / 2 < iVar10)) {
LAB_00212d46:
              iVar9 = Gia_ManFromIfLogicAndVars(pNew,pIfMan,pCut,p_01,vLeavesTemp,vCover,p,p_00);
              goto LAB_00212cac;
            }
            goto LAB_00212d6d;
          }
          uVar11 = (pIfObj->CutBest).iCutFunc;
          if ((int)uVar11 < 0) goto LAB_0021392d;
          uVar11 = uVar11 >> 1;
          if (pIfMan->vTtDecs[uVar22]->nSize <= (int)uVar11) goto LAB_00213854;
          if (pIfMan->vTtDecs[uVar22]->pArray[uVar11] != 0) goto LAB_00212d46;
        }
        iVar9 = Gia_ManFromIfLogicCofVars(pNew,pIfMan,pCut,p_01,vLeavesTemp,vCover,p,p_00);
        goto LAB_00212cac;
      }
      if (local_438 == (sat_solver *)0x0) {
        local_438 = (sat_solver *)If_ManSatBuildXY(*pIVar3->pLutStruct + -0x30);
      }
      if ((pIfMan->pPars->pLutStruct == (char *)0x0) || (pIfMan->pPars->fDeriveLuts == 0)) {
        uVar11 = (pIfObj->CutBest).iCutFunc;
        if ((int)uVar11 < 0) goto LAB_002139a9;
        pwVar6 = pIfMan->puTempW;
        bVar19 = (pIfObj->CutBest).field_0x1f;
        pVVar7 = pIfMan->vTtMem[bVar19];
        if (pVVar7 == (Vec_Mem_t *)0x0) {
          pwVar17 = (word *)0x0;
        }
        else {
          uVar12 = uVar11 >> 1;
          if (pVVar7->nEntries <= (int)uVar12) goto LAB_002139e7;
          pwVar17 = pVVar7->ppPages[uVar12 >> ((byte)pVVar7->LogPageSze & 0x1f)] +
                    (ulong)(uVar12 & pVVar7->PageMask) * (long)pVVar7->nEntrySize;
        }
        uVar12 = pIfMan->nTruth6Words[bVar19];
        if ((uVar11 & 1) == 0) {
          if (0 < (int)uVar12) {
            uVar22 = 0;
            do {
              pwVar6[uVar22] = pwVar17[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar12 != uVar22);
          }
        }
        else if (0 < (int)uVar12) {
          uVar22 = 0;
          do {
            pwVar6[uVar22] = ~pwVar17[uVar22];
            uVar22 = uVar22 + 1;
          } while (uVar12 != uVar22);
        }
        uVar11 = Gia_ManFromIfLogicCreateLut(pNew,pwVar6,p_01,vCover,p,p_00);
      }
      else {
        uVar11 = Gia_ManFromIfLogicFindLut
                           (pIfMan,pNew,pCut,local_438,p_01,vLits,vCover,p,p_00,local_440);
      }
      (pIfObj->field_22).iCopy = uVar11;
      if ((int)uVar11 < 0) goto LAB_0021390e;
      (pIfObj->field_22).iCopy = *(uint *)&(pIfObj->CutBest).field_0x1c >> 0xc & 1 ^ uVar11;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x785,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
LAB_00212cb0:
    lVar21 = lVar21 + 1;
    pVVar15 = pIfMan->vObjs;
    if (pVVar15->nSize <= lVar21) goto LAB_002132af;
    goto LAB_002129e5;
  }
  local_438 = (sat_solver *)0x0;
LAB_002132af:
  if (vLits->pArray != (int *)0x0) {
    free(vLits->pArray);
    vLits->pArray = (int *)0x0;
  }
  free(vLits);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (vLeavesTemp->pArray != (int *)0x0) {
    free(vLeavesTemp->pArray);
    vLeavesTemp->pArray = (int *)0x0;
  }
  free(vLeavesTemp);
  iVar9 = extraout_EDX;
  if (local_438 != (sat_solver *)0x0) {
    sat_solver_delete(local_438);
    iVar9 = extraout_EDX_00;
  }
  iVar10 = pNew->nObjs;
  if (iVar10 < p->nSize) {
    p->nSize = iVar10;
  }
  else {
    Vec_IntFillExtra(p,iVar10,iVar9);
  }
  if (p->nSize != pNew->nObjs) {
    __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x798,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (0 < p->nSize) {
    piVar13 = p->pArray;
    lVar21 = 0;
    do {
      iVar9 = piVar13[lVar21];
      if (0 < iVar9) {
        piVar13[lVar21] = iVar9 + pNew->nObjs;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < p->nSize);
  }
  iVar9 = p_00->nSize;
  if (0 < (long)iVar9) {
    piVar13 = p_00->pArray;
    lVar21 = 0;
    do {
      Vec_IntPush(p,piVar13[lVar21]);
      lVar21 = lVar21 + 1;
    } while (iVar9 != lVar21);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (pNew->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x79f,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->vPacking != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vPacking == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x7a0,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->vConfigs != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vConfigs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x7a1,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  if (pNew->pCellStr != (char *)0x0) {
    __assert_fail("pNew->pCellStr == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x7a2,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
  }
  pNew->vMapping = p;
  pNew->vPacking = local_440;
  pNew->vConfigs = local_448;
  if (local_448 == (Vec_Int_t *)0x0) {
    pNew->pCellStr = (char *)0x0;
  }
  else {
    pcVar14 = If_DsdManGetCellStr(pIfMan->pIfDsdMan);
    if (pcVar14 == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar18 = strlen(pcVar14);
      __dest = (char *)malloc(sVar18 + 1);
      strcpy(__dest,pcVar14);
    }
    pNew->pCellStr = __dest;
    iVar9 = local_448->nSize;
    if ((iVar9 < 1) || (iVar9 == 1)) {
LAB_00213854:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (iVar9 != local_448->pArray[1] * *local_448->pArray + 2) {
      __assert_fail("!vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x7a7,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
    }
  }
  lVar21 = (long)pNew->vCos->nSize;
  if (0 < lVar21) {
    lVar20 = 0;
    do {
      iVar9 = pNew->vCos->pArray[lVar20];
      if (((long)iVar9 < 0) || (pNew->nObjs <= iVar9)) goto LAB_00213873;
      if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar5 = pNew->pObjs + iVar9;
      uVar12 = (uint)*(undefined8 *)pGVar5;
      uVar11 = *(uint *)(pGVar5 + -(ulong)(uVar12 & 0x1fffffff));
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        if (pNew->nObjs <= iVar9) {
LAB_00213892:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar11 = iVar9 - (uVar12 & 0x1fffffff);
        if (((int)uVar11 < 0) || (pNew->vMapping->nSize <= (int)uVar11)) goto LAB_00213854;
        if (pNew->vMapping->pArray[uVar11] == 0) {
          __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x7ac,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar21 != lVar20);
  }
  uVar11 = pNew->nObjs;
  if (1 < (long)(int)uVar11) {
    uVar12 = pNew->vMapping->nSize;
    uVar22 = 1;
    if (1 < (int)uVar12) {
      uVar22 = (ulong)uVar12;
    }
    uVar23 = 1;
    do {
      if (uVar23 == uVar22) goto LAB_00213854;
      piVar13 = pNew->vMapping->pArray;
      uVar24 = piVar13[uVar23];
      if ((ulong)uVar24 != 0) {
        if ((int)uVar12 <= (int)uVar24 || (int)uVar24 < 0) goto LAB_00213854;
        uVar1 = piVar13[uVar24];
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        uVar26 = 0;
        while (uVar1 != uVar26) {
          uVar2 = (piVar13 + uVar24)[uVar26 + 1];
          if (uVar11 <= uVar2) goto LAB_00213873;
          if ((~*(uint *)(pNew->pObjs + uVar2) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pNew->pObjs + uVar2)) {
            if ((int)uVar11 <= (int)uVar2) goto LAB_00213892;
            if (((int)uVar2 < 0) || ((int)uVar12 <= (int)uVar2)) goto LAB_00213854;
            if (piVar13[uVar2] == 0) {
              __assert_fail("!Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x7b3,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
            }
          }
          uVar26 = uVar26 + 1;
          if ((int)uVar12 <= (int)uVar24 || (int)uVar24 < 0) goto LAB_00213854;
        }
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != (long)(int)uVar11);
  }
  lVar21 = (long)pNew->vCis->nSize;
  if (0 < lVar21) {
    lVar20 = 0;
    do {
      iVar9 = pNew->vCis->pArray[lVar20];
      if (((long)iVar9 < 0) || ((int)uVar11 <= iVar9)) {
LAB_00213873:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pNew->pObjs == (Gia_Obj_t *)0x0) break;
      if (pNew->vMapping->nSize <= iVar9) goto LAB_00213854;
      if (pNew->vMapping->pArray[iVar9] != 0) {
        __assert_fail("!Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x7b9,"Gia_Man_t *Gia_ManFromIfLogic(If_Man_t *)");
      }
      lVar20 = lVar20 + 1;
    } while (lVar21 != lVar20);
  }
  if (local_470 == (Vec_Str_t *)0x0) {
    return pNew;
  }
  memset(Buffer,0,1000);
  if (pIfMan->pName == (char *)0x0) {
    pcVar14 = "nameless_";
  }
  else {
    pcVar14 = Extra_FileNameGeneric(pIfMan->pName);
  }
  sprintf(Buffer,"%s_configs.txt",pcVar14);
  if (pcVar14 != (char *)0x0) {
    free(pcVar14);
  }
  __s = fopen(Buffer,"wb");
  if (__s == (FILE *)0x0) {
    pcVar14 = "Cannot open file \"%s\".\n";
    goto LAB_00213833;
  }
  uVar11 = local_470->nCap;
  if (local_470->nSize == uVar11) {
    if ((int)uVar11 < 0x10) {
      if (local_470->pArray == (char *)0x0) {
        pcVar14 = (char *)malloc(0x10);
      }
      else {
        pcVar14 = (char *)realloc(local_470->pArray,0x10);
      }
      local_470->pArray = pcVar14;
      sVar18 = 0x10;
    }
    else {
      sVar18 = (ulong)uVar11 * 2;
      if ((int)sVar18 <= (int)uVar11) goto LAB_002137bc;
      if (local_470->pArray == (char *)0x0) {
        pcVar14 = (char *)malloc(sVar18);
      }
      else {
        pcVar14 = (char *)realloc(local_470->pArray,sVar18);
      }
      local_470->pArray = pcVar14;
    }
    local_470->nCap = (int)sVar18;
  }
LAB_002137bc:
  iVar9 = local_470->nSize;
  local_470->nSize = iVar9 + 1;
  local_470->pArray[iVar9] = '\0';
  pcVar14 = local_470->pArray;
  sVar18 = strlen(pcVar14);
  fwrite(pcVar14,sVar18,1,__s);
  if (local_470->pArray != (char *)0x0) {
    free(local_470->pArray);
    local_470->pArray = (char *)0x0;
  }
  free(local_470);
  fclose(__s);
  pcVar14 = "Finished dumping configs into file \"%s\".\n";
LAB_00213833:
  printf(pcVar14,Buffer);
  return pNew;
}

Assistant:

Gia_Man_t * Gia_ManFromIfLogic( If_Man_t * pIfMan )
{
    int fWriteConfigs = 1;
    Gia_Man_t * pNew, * pHashed = NULL;
    If_Cut_t * pCutBest;
    If_Obj_t * pIfObj, * pIfLeaf;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL, * vConfigs = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover, * vLits;
    Vec_Str_t * vConfigsStr = NULL;
    Ifn_Ntk_t * pNtkCell = NULL;
    sat_solver * pSat = NULL;
    int i, k, Entry;
    assert( !pIfMan->pPars->fDeriveLuts || pIfMan->pPars->fTruth );
//    if ( pIfMan->pPars->fEnableCheck07 )
//        pIfMan->pPars->fDeriveLuts = 0;
    // start mapping and packing
    vMapping  = Vec_IntStart( If_ManObjNum(pIfMan) );
    vMapping2 = Vec_IntStart( 1 );
    if ( pIfMan->pPars->fDeriveLuts && (pIfMan->pPars->pLutStruct || pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u || pIfMan->pPars->fEnableCheck07) )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    if ( pIfMan->pPars->fUseDsdTune )
    {
        int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
        int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
        int nConfigInts = Abc_BitWordNum(nTtBitNum + nPermBitNum + 1);
        vConfigs = Vec_IntAlloc( 1000 );
        Vec_IntPush( vConfigs, 0 );
        Vec_IntPush( vConfigs, nConfigInts );
        if ( fWriteConfigs )
            vConfigsStr = Vec_StrAlloc( 1000 );
    }
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    // iterate through nodes used in the mapping
    vLits    = Vec_IntAlloc( 1000 );
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    If_ManCleanCutData( pIfMan );
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // perform sorting of cut leaves by delay, so that the slowest pin drives the fastest input of the LUT
            if ( !pIfMan->pPars->fUseTtPerm && !pIfMan->pPars->fDelayOpt && !pIfMan->pPars->fDelayOptLut && !pIfMan->pPars->fDsdBalance && 
                 !pIfMan->pPars->pLutStruct && !pIfMan->pPars->fUserRecLib && !pIfMan->pPars->fUserSesLib && !pIfMan->pPars->nGateSize && 
                 !pIfMan->pPars->fEnableCheck75 && !pIfMan->pPars->fEnableCheck75u && !pIfMan->pPars->fEnableCheck07 && !pIfMan->pPars->fUseDsdTune && 
                 !pIfMan->pPars->fUseCofVars && !pIfMan->pPars->fUseAndVars )
                If_CutRotatePins( pIfMan, pCutBest );
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // perform one of the two types of mapping: with and without structures
            if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->pLutStruct )
            {
                if ( pSat == NULL )
                    pSat = (sat_solver *)If_ManSatBuildXY( (int)(pIfMan->pPars->pLutStruct[0] - '0') );
                if ( pIfMan->pPars->pLutStruct && pIfMan->pPars->fDeriveLuts )
                    pIfObj->iCopy = Gia_ManFromIfLogicFindLut( pIfMan, pNew, pCutBest, pSat, vLeaves, vLits, vCover, vMapping, vMapping2, vPacking );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
/*
            else if ( pIfMan->pPars->fUseDsd && pIfMan->pPars->fUseDsdTune && pIfMan->pPars->fDeriveLuts )
            {
                if ( pNtkCell == NULL )
                {
                    assert( If_DsdManGetCellStr(pIfMan->pIfDsdMan) != NULL );
                    pNtkCell = Ifn_NtkParse( If_DsdManGetCellStr(pIfMan->pIfDsdMan) );
                    nLutMax = Ifn_NtkLutSizeMax( pNtkCell );
                    pHashed = Gia_ManStart( 10000 );
                    Vec_IntFillExtra( &pHashed->vCopies, 10000, -1 );
                    for ( k = 0; k < pIfMan->pPars->nLutSize; k++ )
                        Gia_ManAppendCi( pHashed );
                    Gia_ManHashAlloc( pHashed );
                }
                pIfObj->iCopy = Gia_ManFromIfLogicFindCell( pIfMan, pNew, pHashed, pCutBest, pNtkCell, nLutMax, vLeaves, vLits, vCover, vMapping, vMapping2, vConfigs );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
            }
*/
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
                int Mask = Vec_IntEntry(pIfMan->vTtDecs[pCutBest->nLeaves], truthId);
                if ( Mask )
                    pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
                else
                    pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseAndVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicAndVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( pIfMan->pPars->fUseCofVars && pIfMan->pPars->fDeriveLuts && (int)pCutBest->nLeaves > pIfMan->pPars->nLutSize/2 )
            {
                pIfObj->iCopy = Gia_ManFromIfLogicCofVars( pNew, pIfMan, pCutBest, vLeaves, vLeaves2, vCover, vMapping, vMapping2 );
            }
            else if ( (pIfMan->pPars->fDeriveLuts && pIfMan->pPars->fTruth) || pIfMan->pPars->fUseDsd || pIfMan->pPars->fUseTtPerm || pIfMan->pPars->pFuncCell2 )
            {
                word * pTruth = If_CutTruthW(pIfMan, pCutBest);
                if ( pIfMan->pPars->fUseTtPerm )
                    for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
                        if ( If_CutLeafBit(pCutBest, k) )
                            Abc_TtFlip( pTruth, Abc_TtWordNum(pCutBest->nLeaves), k );
                // perform decomposition of the cut
                pIfObj->iCopy = Gia_ManFromIfLogicNode( pIfMan, pNew, i, vLeaves, vLeaves2, pTruth, pIfMan->pPars->pLutStruct, vCover, vMapping, vMapping2, vPacking, (pIfMan->pPars->fEnableCheck75 || pIfMan->pPars->fEnableCheck75u), pIfMan->pPars->fEnableCheck07 );
                pIfObj->iCopy = Abc_LitNotCond( pIfObj->iCopy, pCutBest->fCompl );
                if ( vConfigs && Vec_IntSize(vLeaves) > 1 && !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(pIfObj->iCopy))) && pIfObj->iCopy > 1 )
                    Gia_ManFromIfGetConfig( vConfigs, pIfMan, pCutBest, pIfObj->iCopy, vConfigsStr );
            }
            else
            {
                pIfObj->iCopy = Gia_ManNodeIfToGia( pNew, pIfMan, pIfObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(pIfObj->iCopy), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(pIfObj->iCopy) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(pIfObj->iCopy) );
            }
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
        {
            pIfObj->iCopy = 1;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
    }
    Vec_IntFree( vLits );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
    if ( pNtkCell )
        ABC_FREE( pNtkCell );
    if ( pSat )
        sat_solver_delete(pSat);
    if ( pHashed )
        Gia_ManStop( pHashed );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        If_ManObjNum(pIfMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / If_ManObjNum(pIfMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    assert( pNew->vConfigs == NULL );
    assert( pNew->pCellStr == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    pNew->vConfigs = vConfigs;
    pNew->pCellStr = vConfigs ? Abc_UtilStrsav( If_DsdManGetCellStr(pIfMan->pIfDsdMan) ) : NULL;
    assert( !vConfigs || Vec_IntSize(vConfigs) == 2 + Vec_IntEntry(vConfigs, 0) * Vec_IntEntry(vConfigs, 1) );
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    // verify that internal nodes have mapping
    {
        Gia_Obj_t * pFanin;
        Gia_ManForEachLut( pNew, i )
            Gia_LutForEachFaninObj( pNew, i, pFanin, k )
                assert( !Gia_ObjIsAnd(pFanin) || Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pFanin)) );
    }
    // verify that CIs have no mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCi( pNew, pObj, i )
           assert( !Gia_ObjIsLut(pNew, Gia_ObjId(pNew, pObj)) );
    }
    // dump configuration strings
    if ( vConfigsStr )
    {
        FILE * pFile; int status;
        char * pStr, Buffer[1000] = {0};
        const char * pNameGen = pIfMan->pName? Extra_FileNameGeneric( pIfMan->pName ) : "nameless_";
        sprintf( Buffer, "%s_configs.txt", pNameGen );
        ABC_FREE( pNameGen );
        pFile = fopen( Buffer, "wb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open file \"%s\".\n", Buffer );
            return pNew;
        }
        Vec_StrPush( vConfigsStr, '\0' );
        pStr = Vec_StrArray(vConfigsStr);
        status = fwrite( pStr, strlen(pStr), 1, pFile );
        Vec_StrFree( vConfigsStr );
        fclose( pFile );
        printf( "Finished dumping configs into file \"%s\".\n", Buffer );
    }
    return pNew;
}